

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O2

uint32_t get_pos_len_price(lzma_coder_conflict9 *coder,uint32_t pos,uint32_t len,uint32_t pos_state)

{
  sbyte sVar1;
  int iVar2;
  sbyte sVar3;
  uint32_t uVar4;
  ulong uVar5;
  int iVar6;
  
  uVar5 = 3;
  if (len < 6) {
    uVar5 = (ulong)(len - 2);
  }
  if (pos < 0x80) {
    uVar4 = coder->distances_prices[uVar5][pos];
  }
  else {
    sVar1 = 0x1e;
    if (-1 < (int)pos) {
      sVar1 = 0x12;
    }
    iVar2 = 0x3c;
    if (-1 < (int)pos) {
      iVar2 = 0x24;
    }
    sVar3 = 6;
    if (0x7ffff < pos) {
      sVar3 = sVar1;
    }
    iVar6 = 0xc;
    if (0x7ffff < pos) {
      iVar6 = iVar2;
    }
    uVar4 = coder->align_prices[pos & 0xf] +
            coder->pos_slot_prices[uVar5][(uint)""[pos >> sVar3] + iVar6];
  }
  return uVar4 + (coder->match_len_encoder).prices[pos_state][len - 2];
}

Assistant:

static inline uint32_t
get_pos_len_price(const lzma_coder *const coder, const uint32_t pos,
		const uint32_t len, const uint32_t pos_state)
{
	const uint32_t len_to_pos_state = get_len_to_pos_state(len);
	uint32_t price;

	if (pos < FULL_DISTANCES) {
		price = coder->distances_prices[len_to_pos_state][pos];
	} else {
		const uint32_t pos_slot = get_pos_slot_2(pos);
		price = coder->pos_slot_prices[len_to_pos_state][pos_slot]
				+ coder->align_prices[pos & ALIGN_MASK];
	}

	price += get_len_price(&coder->match_len_encoder, len, pos_state);

	return price;
}